

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::set_frame_size(PathTracer *this,size_t width,size_t height)

{
  bool bVar1;
  size_t height_local;
  size_t width_local;
  PathTracer *this_local;
  
  if ((this->state != INIT) && (this->state != READY)) {
    stop(this);
  }
  HDRImageBuffer::resize(&this->sampleBuffer,width,height);
  ImageBuffer::resize(&this->frameBuffer,width,height);
  bVar1 = has_valid_configuration(this);
  if (bVar1) {
    this->state = READY;
  }
  return;
}

Assistant:

void PathTracer::set_frame_size(size_t width, size_t height) {
    if (state != INIT && state != READY) {
      stop();
    }
    sampleBuffer.resize(width, height);
    frameBuffer.resize(width, height);
    if (has_valid_configuration()) {
      state = READY;
    }
  }